

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O2

int EVP_PKEY_copy_parameters(EVP_PKEY *to,EVP_PKEY *from)

{
  code *UNRECOVERED_JUMPTABLE;
  int line;
  int iVar1;
  
  if (to->save_type == 0) {
    evp_pkey_set_method((EVP_PKEY *)to,(EVP_PKEY_ASN1_METHOD *)from->ameth);
  }
  else if (to->save_type != from->save_type) {
    iVar1 = 0x67;
    line = 0x6e;
    goto LAB_00162a90;
  }
  iVar1 = EVP_PKEY_missing_parameters(from);
  if (iVar1 == 0) {
    iVar1 = EVP_PKEY_missing_parameters(to);
    if (iVar1 != 0) {
      if (from->ameth == (EVP_PKEY_ASN1_METHOD *)0x0) {
        return 0;
      }
      UNRECOVERED_JUMPTABLE = *(code **)(from->ameth + 0x90);
      if (UNRECOVERED_JUMPTABLE == (code *)0x0) {
        return 0;
      }
      iVar1 = (*UNRECOVERED_JUMPTABLE)(to,from);
      return iVar1;
    }
    iVar1 = EVP_PKEY_cmp_parameters(to,from);
    if (iVar1 == 1) {
      return 1;
    }
    iVar1 = 0x68;
    line = 0x7c;
  }
  else {
    iVar1 = 0x76;
    line = 0x73;
  }
LAB_00162a90:
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp.cc"
                ,line);
  return 0;
}

Assistant:

int EVP_PKEY_copy_parameters(EVP_PKEY *to, const EVP_PKEY *from) {
  if (to->type == EVP_PKEY_NONE) {
    evp_pkey_set_method(to, from->ameth);
  } else if (to->type != from->type) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DIFFERENT_KEY_TYPES);
    return 0;
  }

  if (EVP_PKEY_missing_parameters(from)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MISSING_PARAMETERS);
    return 0;
  }

  // Once set, parameters may not change.
  if (!EVP_PKEY_missing_parameters(to)) {
    if (EVP_PKEY_cmp_parameters(to, from) == 1) {
      return 1;
    }
    OPENSSL_PUT_ERROR(EVP, EVP_R_DIFFERENT_PARAMETERS);
    return 0;
  }

  if (from->ameth && from->ameth->param_copy) {
    return from->ameth->param_copy(to, from);
  }

  // TODO(https://crbug.com/boringssl/536): If the algorithm takes no
  // parameters, copying them should vacuously succeed.
  return 0;
}